

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O1

void __thiscall boost::detail::thread_data_base::~thread_data_base(thread_data_base *this)

{
  pointer ppVar1;
  pthread_mutex_t *m_;
  pointer psVar2;
  int iVar3;
  pointer ppVar4;
  pointer psVar5;
  pthread_mutex_scoped_lock pStack_38;
  
  this->_vptr_thread_data_base = (_func_int **)&PTR__thread_data_base_001ce590;
  ppVar1 = (this->notify).
           super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (this->notify).
                super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    mutex::unlock(ppVar4->second);
    m_ = &ppVar4->first->internal_mutex;
    pthread::pthread_mutex_scoped_lock::pthread_mutex_scoped_lock(&pStack_38,m_);
    iVar3 = pthread_cond_broadcast((pthread_cond_t *)(m_ + 1));
    if (iVar3 != 0) {
      __assert_fail("!pthread_cond_broadcast(&cond)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/condition_variable.hpp"
                    ,0x96,"void boost::condition_variable::notify_all()");
    }
    if (pStack_38.locked == true) {
      pthread::pthread_mutex_scoped_lock::unlock(&pStack_38);
    }
  }
  psVar5 = (this->async_states_).
           super__Vector_base<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->async_states_).
           super__Vector_base<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (psVar5 == psVar2) {
      std::
      vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
      ::~vector(&this->async_states_);
      ppVar4 = (this->notify).
               super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ppVar4 != (pointer)0x0) {
        operator_delete(ppVar4,(long)(this->notify).
                                     super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppVar4);
      }
      std::
      _Rb_tree<const_void_*,_std::pair<const_void_*const,_boost::detail::tss_data_node>,_std::_Select1st<std::pair<const_void_*const,_boost::detail::tss_data_node>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
      ::~_Rb_tree(&(this->tss_data)._M_t);
      condition_variable::~condition_variable(&this->sleep_condition);
      mutex::~mutex(&this->sleep_mutex);
      condition_variable::~condition_variable(&this->done_condition);
      mutex::~mutex(&this->data_mutex);
      shared_count::~shared_count(&(this->self).pn);
      weak_count::~weak_count
                (&(this->super_enable_shared_from_this<boost::detail::thread_data_base>).weak_this_.
                  pn);
      return;
    }
    if (psVar5->px == (shared_state_base *)0x0) break;
    shared_state_base::notify_deferred(psVar5->px);
    psVar5 = psVar5 + 1;
  }
  __assert_fail("px != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                ,0x2de,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::detail::shared_state_base>::operator->() const [T = boost::detail::shared_state_base]"
               );
}

Assistant:

thread_data_base::~thread_data_base()
        {
            for (notify_list_t::iterator i = notify.begin(), e = notify.end();
                    i != e; ++i)
            {
                i->second->unlock();
                i->first->notify_all();
            }
            for (async_states_t::iterator i = async_states_.begin(), e = async_states_.end();
                    i != e; ++i)
            {
                (*i)->notify_deferred();
            }
        }